

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb4Sweep.c
# Opt level: O2

Vec_Int_t * Llb_Nonlin4SweepVars2Q(Aig_Man_t *pAig,Vec_Int_t *vOrder,int fAddLis)

{
  uint uVar1;
  int iVar2;
  Vec_Int_t *p;
  int *piVar3;
  ulong uVar4;
  Aig_Obj_t *pAVar5;
  int iVar6;
  ulong uVar7;
  
  uVar7 = 0;
  p = Vec_IntAlloc(0);
  uVar1 = pAig->vObjs->nSize;
  if (p->nCap < (int)uVar1) {
    if (p->pArray == (int *)0x0) {
      piVar3 = (int *)malloc((long)(int)uVar1 << 2);
    }
    else {
      piVar3 = (int *)realloc(p->pArray,(long)(int)uVar1 << 2);
    }
    p->pArray = piVar3;
    if (piVar3 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    p->nCap = uVar1;
  }
  uVar4 = 0;
  if (0 < (int)uVar1) {
    uVar4 = (ulong)uVar1;
  }
  for (; uVar4 != uVar7; uVar7 = uVar7 + 1) {
    p->pArray[uVar7] = 1;
  }
  p->nSize = uVar1;
  for (iVar6 = 0; iVar2 = pAig->nRegs, iVar6 < iVar2; iVar6 = iVar6 + 1) {
    pAVar5 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vCis,pAig->nTruePis + iVar6);
    iVar2 = Llb_ObjBddVar(vOrder,pAVar5);
    Vec_IntWriteEntry(p,iVar2,0);
  }
  if (fAddLis != 0) {
    for (iVar6 = 0; iVar6 < iVar2; iVar6 = iVar6 + 1) {
      pAVar5 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vCos,pAig->nTruePos + iVar6);
      iVar2 = Llb_ObjBddVar(vOrder,pAVar5);
      Vec_IntWriteEntry(p,iVar2,0);
      iVar2 = pAig->nRegs;
    }
  }
  return p;
}

Assistant:

Vec_Int_t * Llb_Nonlin4SweepVars2Q( Aig_Man_t * pAig, Vec_Int_t * vOrder, int fAddLis )
{
    Vec_Int_t * vVars2Q;
    Aig_Obj_t * pObj;
    int i;
    vVars2Q = Vec_IntAlloc( 0 );
    Vec_IntFill( vVars2Q, Aig_ManObjNumMax(pAig), 1 );
    // add flop outputs
    Saig_ManForEachLo( pAig, pObj, i )
        Vec_IntWriteEntry( vVars2Q, Llb_ObjBddVar(vOrder, pObj), 0 );
    // add flop inputs
    if ( fAddLis )
    Saig_ManForEachLi( pAig, pObj, i )
        Vec_IntWriteEntry( vVars2Q, Llb_ObjBddVar(vOrder, pObj), 0 );
    return vVars2Q;
}